

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

int __thiscall Path::mkdir(Path *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  undefined8 unaff_RBP;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  char buf [4098];
  undefined8 uVar5;
  
  puVar3 = (uint *)__errno_location();
  *puVar3 = 0;
  iVar2 = ::mkdir((this->super_String).mString._M_dataplus._M_p,__mode);
  uVar5 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  iVar4 = (int)uVar5;
  if ((iVar2 != 0) && ((*puVar3 | 4) != 0x15)) {
    if (((int)__path == 0) ||
       (uVar6 = (this->super_String).mString._M_string_length, 0x1000 < uVar6)) {
      iVar4 = 0;
    }
    else {
      strcpy(buf,(this->super_String).mString._M_dataplus._M_p);
      bVar1 = String::endsWith(&this->super_String,'/',CaseSensitive);
      if (!bVar1) {
        (buf + uVar6)[0] = '/';
        (buf + uVar6)[1] = '\0';
        uVar6 = uVar6 + 1;
      }
      uVar7 = 1;
      while( true ) {
        uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),uVar6 <= uVar7);
        iVar4 = (int)uVar5;
        if (uVar6 <= uVar7) break;
        if (buf[uVar7] == '/') {
          buf[uVar7] = '\0';
          iVar2 = ::mkdir(buf,__mode);
          if ((iVar2 != 0) && ((*puVar3 | 4) != 0x15)) {
            return iVar4;
          }
          buf[uVar7] = '/';
        }
        uVar7 = uVar7 + 1;
      }
    }
  }
  return iVar4;
}

Assistant:

bool Path::mkdir(const Path &path, MkDirMode mkdirMode, mode_t permissions)
{
    errno = 0;
#ifdef _WIN32
    (void) permissions;   // unused on windows
    if (!::_wmkdir(Utf8To16(path.c_str())) || errno == EEXIST)
#else
    if (!::mkdir(path.constData(), permissions) || errno == EEXIST || errno == EISDIR)
#endif
    {
        // mkdir call succeeded or it failed because the dir already exists
        return true;
    }
    if (mkdirMode == Single)
        return false;
    if (path.size() > PATH_MAX)
        return false;

    // directory creation failed so far
    // because mkdirMode == Recursive, we go along the path and create
    // directories, continuing while dir creation is successful or it failed
    // only because directories already exist.

    char buf[PATH_MAX + 2];
    strcpy(buf, path.constData());
    size_t len = path.size();
    if (!path.endsWith('/')) {
        buf[len++] = '/';
        buf[len] = '\0';
    }

    for (size_t i = 1; i < len; ++i) {
        if (buf[i] == '/') {
            buf[i] = 0;
#ifdef _WIN32
            Utf8To16 tmp2(buf);
            const int r = ::_wmkdir(tmp2);
#else
            const int r = ::mkdir(buf, permissions);
#endif
            if (r && errno != EEXIST && errno != EISDIR)
                return false;
            buf[i] = '/';
        }
    }
    return true;
}